

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O0

vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *
baryonyx::itm::make_unsorted_merged_constraints
          (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *__return_storage_ptr__,context *ctx,problem *pb)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator iVar4;
  iterator iVar5;
  undefined1 local_58 [8];
  unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
  cache;
  problem *pb_local;
  context *ctx_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *ret;
  
  cache._M_h._M_single_bucket = (__node_base_ptr)pb;
  std::
  unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                   *)local_58);
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  vector(__return_storage_ptr__);
  sVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    ((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                     (cache._M_h._M_single_bucket + 9));
  sVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    ((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                     (cache._M_h._M_single_bucket + 0xf));
  sVar3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    ((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                     (cache._M_h._M_single_bucket + 0xc));
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  reserve(__return_storage_ptr__,sVar1 + sVar2 + sVar3);
  fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
            (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                  *)local_58,equal,(problem *)cache._M_h._M_single_bucket,__return_storage_ptr__);
  fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
            (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                  *)local_58,less,(problem *)cache._M_h._M_single_bucket,__return_storage_ptr__);
  fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
            (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                  *)local_58,greater,(problem *)cache._M_h._M_single_bucket,__return_storage_ptr__);
  iVar4 = std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::begin(__return_storage_ptr__);
  iVar5 = std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,baryonyx::itm::make_unsorted_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>
            (iVar4._M_current,iVar5._M_current);
  std::
  unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                    *)local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<merged_constraint>
make_unsorted_merged_constraints(const baryonyx::context& ctx,
                                 const baryonyx::problem& pb)
{
    std::unordered_map<std::vector<baryonyx::function_element>,
                       std::size_t,
                       merged_constraint_hash>
      cache;

    std::vector<merged_constraint> ret;
    ret.reserve(pb.equal_constraints.size() + pb.less_constraints.size() +
                pb.greater_constraints.size());

    fill_merged_constraints(
      ctx, cache, baryonyx::operator_type::equal, pb, ret);
    fill_merged_constraints(
      ctx, cache, baryonyx::operator_type::less, pb, ret);
    fill_merged_constraints(
      ctx, cache, baryonyx::operator_type::greater, pb, ret);

    std::sort(ret.begin(), ret.end(), [](const auto& lhs, const auto& rhs) {
        return lhs.id < rhs.id;
    });

    return ret;
}